

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O1

_Bool run_container_contains(run_container_t *run,uint16_t pos)

{
  rle16_t *prVar1;
  bool bVar2;
  int iVar3;
  uint in_EDX;
  uint uVar4;
  uint uVar5;
  
  prVar1 = run->runs;
  iVar3 = run->n_runs + -1;
  uVar5 = 0;
  do {
    if (iVar3 < (int)uVar5) {
      uVar4 = ~uVar5;
      break;
    }
    uVar4 = uVar5 + iVar3 >> 1;
    if (prVar1[uVar4].value < pos) {
      uVar5 = uVar4 + 1;
      bVar2 = true;
      uVar4 = in_EDX;
    }
    else if (pos < prVar1[uVar4].value) {
      iVar3 = uVar4 - 1;
      bVar2 = true;
      uVar4 = in_EDX;
    }
    else {
      bVar2 = false;
    }
    in_EDX = uVar4;
  } while (bVar2);
  if (((int)uVar4 < 0) &&
     ((uVar4 == 0xffffffff ||
      ((int)(uint)prVar1[-uVar4 - 2].length < (int)((uint)pos - (uint)prVar1[-uVar4 - 2].value)))))
  {
    return false;
  }
  return true;
}

Assistant:

inline bool run_container_contains(const run_container_t *run, uint16_t pos) {
    int32_t index = interleavedBinarySearch(run->runs, run->n_runs, pos);
    if (index >= 0) return true;
    index = -index - 2;  // points to preceding value, possibly -1
    if (index != -1) {   // possible match
        int32_t offset = pos - run->runs[index].value;
        int32_t le = run->runs[index].length;
        if (offset <= le) return true;
    }
    return false;
}